

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_slider_float(nk_context *ctx,float min_value,float *value,float max_value,float value_step)

{
  nk_style_slider *pnVar1;
  nk_image *img;
  float fVar2;
  nk_vec2 nVar3;
  nk_color c;
  nk_window *pnVar4;
  nk_panel *pnVar5;
  nk_user_font *font;
  _func_void_nk_command_buffer_ptr_nk_handle *p_Var6;
  undefined1 auVar7 [12];
  nk_widget_layout_states nVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  nk_style_slider *pnVar12;
  nk_context *in;
  long lVar13;
  int *piVar14;
  nk_command_buffer *out;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar24;
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  nk_rect bounds_00;
  nk_rect bounds_01;
  nk_rect b;
  nk_rect rect;
  nk_rect rect_00;
  nk_rect rect_01;
  nk_rect r;
  nk_rect rect_02;
  nk_rect rect_03;
  nk_rect rect_04;
  nk_rect rect_05;
  nk_rect r_00;
  nk_rect r_01;
  long lStackY_160;
  float local_14c;
  undefined8 local_108;
  undefined8 local_e8;
  nk_flags local_8c;
  undefined1 local_88 [16];
  nk_rect bounds;
  undefined1 auVar20 [16];
  undefined8 uVar18;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4c29,"int nk_slider_float(struct nk_context *, float, float *, float, float)");
  }
  pnVar4 = ctx->current;
  if (pnVar4 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4c2a,"int nk_slider_float(struct nk_context *, float, float *, float, float)");
  }
  pnVar5 = pnVar4->layout;
  if (pnVar5 == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4c2b,"int nk_slider_float(struct nk_context *, float, float *, float, float)");
  }
  if (value == (float *)0x0) {
    __assert_fail("value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4c2c,"int nk_slider_float(struct nk_context *, float, float *, float, float)");
  }
  nVar8 = nk_widget(&bounds,ctx);
  if (nVar8 == NK_WIDGET_INVALID) {
    return 0;
  }
  in = (nk_context *)0x0;
  if ((nVar8 != NK_WIDGET_ROM) && ((pnVar5->flags & 0x800) == 0)) {
    in = ctx;
  }
  fVar2 = *value;
  out = &pnVar4->buffer;
  fVar26 = (ctx->style).slider.cursor_size.x;
  nVar3 = (ctx->style).slider.padding;
  fVar15 = nVar3.x;
  fVar25 = nVar3.y;
  bounds_00.x = bounds.x + fVar15;
  bounds_00.y = bounds.y + fVar25;
  auVar19._0_4_ = fVar15 + fVar15 + fVar26;
  auVar7._4_8_ = (ulong)nVar3 >> 0x20;
  auVar7._0_4_ = auVar19._0_4_;
  auVar20._0_8_ = auVar7._0_8_;
  auVar20._8_4_ = fVar25;
  auVar20._12_4_ = fVar25;
  auVar19._8_8_ = auVar20._8_8_;
  auVar19._4_4_ = fVar25 + fVar25;
  auVar21._8_8_ = 0;
  auVar21._0_4_ = bounds.w;
  auVar21._4_4_ = bounds.h;
  auVar21 = maxps(auVar19,auVar21);
  auVar22._0_4_ = auVar21._0_4_ - (fVar15 + fVar15);
  auVar22._4_4_ = auVar21._4_4_ - (fVar25 + fVar25);
  auVar22._8_4_ = auVar21._8_4_ - 0.0;
  auVar22._12_4_ = auVar21._12_4_ - 0.0;
  fVar15 = fVar2;
  if ((ctx->style).slider.show_buttons != 0) {
    font = (ctx->style).font;
    bounds_00.h = auVar22._4_4_;
    bounds_00.w = auVar22._4_4_;
    iVar9 = nk_do_button_symbol(&local_8c,out,bounds_00,(ctx->style).slider.dec_symbol,
                                NK_BUTTON_DEFAULT,&(ctx->style).slider.dec_button,&in->input,font);
    if (iVar9 != 0) {
      fVar15 = fVar2 - value_step;
    }
    bounds_01.h = auVar22._4_4_;
    bounds_01.w = auVar22._4_4_;
    bounds_01.y = bounds_00.y;
    bounds_01.x = (bounds_00.x + auVar22._0_4_) - auVar22._4_4_;
    iVar9 = nk_do_button_symbol(&local_8c,out,bounds_01,(ctx->style).slider.inc_symbol,
                                NK_BUTTON_DEFAULT,&(ctx->style).slider.inc_button,&in->input,font);
    if (iVar9 != 0) {
      fVar15 = fVar15 + value_step;
    }
    fVar26 = (ctx->style).slider.spacing.x;
    bounds_00.x = bounds_00.x + auVar22._4_4_ + fVar26;
    fVar25 = auVar22._4_4_ + auVar22._4_4_;
    auVar22._0_4_ = auVar22._0_4_ - (fVar25 + fVar26 + fVar26);
    fVar26 = (ctx->style).slider.cursor_size.x;
  }
  fVar25 = min_value;
  if (max_value <= min_value) {
    fVar25 = max_value;
    max_value = min_value;
  }
  if (max_value <= fVar15) {
    fVar15 = max_value;
  }
  local_14c = fVar25;
  if (fVar25 <= fVar15) {
    local_14c = fVar15;
  }
  fVar29 = (max_value - fVar25) / value_step;
  fVar30 = fVar26 * 0.5;
  fVar16 = fVar30 + bounds_00.x;
  bounds_00.x = bounds_00.x + fVar30;
  fVar24 = auVar22._4_4_;
  rect_04.w = auVar22._0_4_ - fVar26;
  fVar28 = rect_04.w / fVar29;
  fVar27 = ((local_14c - fVar25) / value_step) * fVar28 + fVar16;
  fVar15 = (ctx->style).slider.cursor_size.y;
  local_88 = ZEXT416((uint)fVar27);
  fVar27 = (fVar28 * 0.5 + fVar27) - fVar26 * 0.5;
  fVar17 = (fVar24 * 0.5 + bounds_00.y) - fVar15 * 0.5;
  auVar23._4_12_ = auVar22._4_12_;
  auVar23._0_4_ = auVar22._0_4_ - fVar26;
  uVar18 = auVar23._0_8_;
  uVar11 = ctx->last_widget_state & 2 | 4;
  ctx->last_widget_state = uVar11;
  r_01.h = fVar15;
  r_01.w = fVar26;
  if (((in != (nk_context *)0x0) &&
      (iVar9 = (in->input).mouse.buttons[0].down, b.y = fVar17, b.x = fVar27, b.h = fVar15,
      b.w = fVar26, iVar10 = nk_input_has_mouse_click_down_in_rect(&in->input,NK_BUTTON_LEFT,b,1),
      iVar9 != 0)) && (iVar10 != 0)) {
    fVar30 = (in->input).mouse.pos.x - (fVar30 + fVar27);
    fVar27 = (ctx->style).slider.padding.x;
    fVar29 = (rect_04.w - (fVar27 + fVar27)) / fVar29;
    ctx->last_widget_state = 0x22;
    fVar27 = -fVar30;
    if (-fVar30 <= fVar30) {
      fVar27 = fVar30;
    }
    uVar11 = 0x22;
    if (fVar29 <= fVar27) {
      fVar29 = (float)(int)(fVar27 / fVar29);
      fVar29 = local_14c +
               (float)(~-(uint)(0.0 < fVar30) & (uint)-fVar29 | (uint)fVar29 & -(uint)(0.0 < fVar30)
                      ) * value_step;
      if (max_value <= fVar29) {
        fVar29 = max_value;
      }
      local_14c = fVar25;
      if (fVar25 <= fVar29) {
        local_14c = fVar29;
      }
      fVar25 = ((local_14c - fVar25) / value_step) * fVar28 + fVar16;
      local_88 = ZEXT416((uint)fVar25);
      (in->input).mouse.buttons[0].clicked_pos.x = fVar28 * 0.5 + fVar25;
    }
  }
  rect.y = bounds_00.y;
  rect.x = bounds_00.x;
  rect.w = (float)(int)uVar18;
  rect.h = (float)(int)((ulong)uVar18 >> 0x20);
  iVar9 = nk_input_is_mouse_hovering_rect(&in->input,rect);
  rect_00.y = bounds_00.y;
  rect_00.x = bounds_00.x;
  if (iVar9 == 0) {
LAB_0012e603:
    rect_01.y = bounds_00.y;
    rect_01.x = bounds_00.x;
    rect_01.h = fVar24;
    rect_01.w = auVar23._0_4_;
    iVar9 = nk_input_is_mouse_prev_hovering_rect(&in->input,rect_01);
    if (iVar9 == 0) goto LAB_0012e63e;
    uVar11 = uVar11 | 0x40;
  }
  else {
    ctx->last_widget_state = 0x12;
    rect_00.w = (float)(int)uVar18;
    rect_00.h = (float)(int)((ulong)uVar18 >> 0x20);
    iVar9 = nk_input_is_mouse_prev_hovering_rect(&in->input,rect_00);
    if (iVar9 != 0) {
      uVar11 = 0x12;
      goto LAB_0012e603;
    }
    uVar11 = 0x1a;
  }
  ctx->last_widget_state = uVar11;
LAB_0012e63e:
  p_Var6 = (ctx->style).slider.draw_begin;
  if (p_Var6 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
    (*p_Var6)(out,(nk_handle)(ctx->style).slider.userdata.ptr);
    uVar11 = ctx->last_widget_state;
  }
  fVar25 = -fVar26 * 0.5 + (float)local_88._0_4_;
  pnVar1 = &(ctx->style).slider;
  if ((uVar11 & 0x20) == 0) {
    if ((uVar11 & 0x10) == 0) {
      lVar13 = 0x78;
      lStackY_160 = 100;
      pnVar12 = pnVar1;
    }
    else {
      pnVar12 = (nk_style_slider *)&(ctx->style).slider.hover;
      lVar13 = 0x98;
      lStackY_160 = 0x68;
    }
  }
  else {
    pnVar12 = (nk_style_slider *)&(ctx->style).slider.active;
    lVar13 = 0xb8;
    lStackY_160 = 0x6c;
  }
  piVar14 = (int *)((long)&(pnVar1->normal).type + lVar13);
  c = *(nk_color *)((long)&(pnVar1->normal).type + lStackY_160);
  fVar29 = fVar24 / -12.0 + fVar17 + fVar15 * 0.5;
  if ((pnVar12->normal).type == NK_STYLE_ITEM_IMAGE) {
    r.y = bounds_00.y;
    r.x = bounds_00.x;
    r.w = (float)(int)uVar18;
    r.h = (float)(int)((ulong)uVar18 >> 0x20);
    nk_draw_image(out,r,&(pnVar12->normal).data.image,(nk_color)0xffffffff);
  }
  else {
    rect_02.y = bounds_00.y;
    rect_02.x = bounds_00.x;
    rect_02.w = (float)(int)uVar18;
    rect_02.h = (float)(int)((ulong)uVar18 >> 0x20);
    nk_fill_rect(out,rect_02,(ctx->style).slider.rounding,(pnVar12->normal).data.color);
    rect_03.y = bounds_00.y;
    rect_03.x = bounds_00.x;
    rect_03.w = (float)(int)uVar18;
    rect_03.h = (float)(int)((ulong)uVar18 >> 0x20);
    nk_stroke_rect(out,rect_03,(ctx->style).slider.rounding,(ctx->style).slider.border,
                   (ctx->style).slider.border_color);
  }
  rect_04.h = fVar24 / 6.0;
  rect_04.x = fVar16;
  rect_04.y = fVar29;
  nk_fill_rect(out,rect_04,(ctx->style).slider.rounding,c);
  rect_05.w = (fVar26 * 0.5 + fVar25) - fVar16;
  rect_05.h = fVar24 / 6.0;
  rect_05.x = fVar16;
  rect_05.y = fVar29;
  nk_fill_rect(out,rect_05,(ctx->style).slider.rounding,(ctx->style).slider.bar_filled);
  img = (nk_image *)(piVar14 + 2);
  if (*piVar14 == 1) {
    r_00.y = fVar17;
    r_00.x = fVar25;
    r_00.w = fVar26;
    r_00.h = fVar15;
    nk_draw_image(out,r_00,img,(nk_color)0xffffffff);
  }
  else {
    r_01.y = fVar17;
    r_01.x = fVar25;
    nk_fill_circle(out,r_01,(nk_color)(img->handle).id);
  }
  p_Var6 = (ctx->style).slider.draw_end;
  if (p_Var6 != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
    (*p_Var6)(out,(nk_handle)(ctx->style).slider.userdata.ptr);
  }
  *value = local_14c;
  return (uint)(fVar2 != local_14c);
}

Assistant:

NK_API int
nk_slider_float(struct nk_context *ctx, float min_value, float *value, float max_value,
    float value_step)
{
    struct nk_window *win;
    struct nk_panel *layout;
    struct nk_input *in;
    const struct nk_style *style;

    int ret = 0;
    float old_value;
    struct nk_rect bounds;
    enum nk_widget_layout_states state;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    NK_ASSERT(value);
    if (!ctx || !ctx->current || !ctx->current->layout || !value)
        return ret;

    win = ctx->current;
    style = &ctx->style;
    layout = win->layout;

    state = nk_widget(&bounds, ctx);
    if (!state) return ret;
    in = (state == NK_WIDGET_ROM || layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;

    old_value = *value;
    *value = nk_do_slider(&ctx->last_widget_state, &win->buffer, bounds, min_value,
                old_value, max_value, value_step, &style->slider, in, style->font);
    return (old_value > *value || old_value < *value);
}